

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

Vec_Int_t * Vta_ManCollectNodes(Vta_Man_t *p,int f)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Vta_Obj_t *pThis;
  
  p->vOrder->nSize = 0;
  pGVar2 = p->pGia;
  iVar1 = pGVar2->vCos->nSize;
  if (iVar1 <= pGVar2->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar1 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = *pGVar2->vCos->pArray;
  if (((long)iVar1 < 0) || (pGVar2->nObjs <= iVar1)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pThis = Vga_ManFind(p,iVar1 - (*(uint *)(pGVar2->pObjs + iVar1) & 0x1fffffff),f);
  if (pThis == (Vta_Obj_t *)0x0) {
    __assert_fail("pThis != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x1ee,"Vec_Int_t *Vta_ManCollectNodes(Vta_Man_t *, int)");
  }
  if (-1 < *(int *)&pThis->field_0xc) {
    Vta_ManCollectNodes_rec(p,pThis,p->vOrder);
    if (*(int *)&pThis->field_0xc < 0) {
      return p->vOrder;
    }
    __assert_fail("pThis->fVisit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x1f1,"Vec_Int_t *Vta_ManCollectNodes(Vta_Man_t *, int)");
  }
  __assert_fail("!pThis->fVisit",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                ,0x1ef,"Vec_Int_t *Vta_ManCollectNodes(Vta_Man_t *, int)");
}

Assistant:

Vec_Int_t * Vta_ManCollectNodes( Vta_Man_t * p, int f )
{
    Vta_Obj_t * pThis;
    Gia_Obj_t * pObj;
    Vec_IntClear( p->vOrder );
    pObj = Gia_ManPo( p->pGia, 0 );
    pThis = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), f );
    assert( pThis != NULL );
    assert( !pThis->fVisit );
    Vta_ManCollectNodes_rec( p, pThis, p->vOrder );
    assert( pThis->fVisit );
    return p->vOrder;
}